

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectAppearance.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::ObjectAppearance::ObjectAppearance
          (ObjectAppearance *this,KUINT8 PerCent,ObjectDamage OD,KBOOL Predist,KBOOL State,
          KBOOL Smoking,KBOOL Flaming)

{
  KException *this_00;
  allocator<char> local_51;
  KString local_50;
  
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__ObjectAppearance_00219380;
  if (PerCent < 0x65) {
    (this->m_GeneralAppearanceUnion).m_ui16GeneralAppearance =
         (ushort)Flaming << 0xd |
         (ushort)Smoking << 0xc | (ushort)State << 0xb |
         (ushort)Predist << 10 | (ushort)PerCent |
         (ushort)((OD & (ObjectDestroyed|ObjectDamaged)) << 8) |
         (ushort)*(undefined4 *)&this->m_GeneralAppearanceUnion & 0xc000;
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"ObjectAppearance",&local_51);
  KException::KException<char_const*>(this_00,&local_50,8,"PerCent Acceptable values are 0-100.");
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

ObjectAppearance::ObjectAppearance(KUINT8 PerCent, ObjectDamage OD, KBOOL Predist, KBOOL State,
                                   KBOOL Smoking, KBOOL Flaming) noexcept(false)
{
    if( PerCent > 100 ) throw KException( __FUNCTION__, INVALID_DATA, "PerCent Acceptable values are 0-100." );

    m_GeneralAppearanceUnion.m_ui16PcComp = PerCent;
    m_GeneralAppearanceUnion.m_ui16Dmg = OD;
    m_GeneralAppearanceUnion.m_ui16Predistributed = Predist;
    m_GeneralAppearanceUnion.m_ui16State = State;
    m_GeneralAppearanceUnion.m_ui16Smoking = Smoking;
    m_GeneralAppearanceUnion.m_ui16Flaming = Flaming;
}